

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdpy.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  int ar_len;
  int local_c;
  
  if (argc < 4) {
    wins_array = create_wins_array(argc,argv,&local_c);
    test_colors(wins_array,local_c);
    test_fonts(wins_array,local_c);
    test_bits(wins_array,local_c);
    puts("Hit RETURN to exit:");
    getchar();
    return 0;
  }
  pcVar3 = "** usage: testdpy [scrn1] [scrn2]\n";
  uVar2 = Am_Error("** usage: testdpy [scrn1] [scrn2]\n");
  (**(code **)(*(long *)pcVar3 + 0x160))();
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&plum,&green,0xa0,0x6e,100,0x37,0,uVar2);
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&orange,&blue,0xa0,0xd2,100,0x37,0);
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&grey,&white,0xa0,0x136,100,0x37,0);
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&orange,&black,0xa0,0x19a,100,0x37,0);
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&black,&orange,0x1e,10,100,0x37,0);
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&black,&orchid,0x1e,0x6e,100,0x37,0);
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&black,&purple,0x1e,0xd2,100,0x37,0);
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&black4,&grey,0x1e,0x136,100,0x37,0);
  (**(code **)(*(long *)pcVar3 + 0x160))(pcVar3,&black,&plum,0x1e,0x19a,100,0x37,0);
  iVar1 = (**(code **)(*(long *)pcVar3 + 0xa0))(pcVar3);
  return iVar1;
}

Assistant:

int
main(int argc, char **argv)
{

  if (argc > 3) {
    Am_Error("** usage: testdpy [scrn1] [scrn2]\n");
  };

  int ar_len;
  wins_array = create_wins_array(argc, argv, ar_len);

  test_colors(wins_array, ar_len);
  test_fonts(wins_array, ar_len);
  test_bits(wins_array, ar_len);
//  test_win_props (wins_array, ar_len);

///
///  Exit
///
#if _MACINTOSH
  // on the Macintosh, we need to be in the main loop in order to
  // get cursor changes correctly.

  cout << "Entering main loop" << endl;
  Am_Drawonable::Main_Loop();
#else
  // but on other machines we want to test for crash on exit.
  printf("Hit RETURN to exit:\n");
  getchar();
#endif

  return 0;
}